

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

ifstream * amrex::VisMF::OpenStream(string *fileName)

{
  _Ios_Openmode _Var1;
  mapped_type *pmVar2;
  ifstream *piVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  PersistentIFStream *pifs;
  streamoff in_stack_ffffffffffffff98;
  fpos<__mbstate_t> *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  streamoff local_30;
  __mbstate_t in_stack_ffffffffffffffd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
  *in_stack_ffffffffffffffe0;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
           ::operator[](in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8);
  if ((pmVar2->isOpen & 1U) == 0) {
    piVar3 = (ifstream *)operator_new(0x208);
    std::ifstream::ifstream(piVar3);
    pmVar2->pstr = piVar3;
    if ((setBuf & 1) != 0) {
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      pcVar4 = (char *)std::ifstream::rdbuf();
      pcVar5 = Vector<char,_std::allocator<char>_>::dataPtr
                         ((Vector<char,_std::allocator<char>_> *)0x121f3d5);
      Vector<char,_std::allocator<char>_>::size((Vector<char,_std::allocator<char>_> *)0x121f3e8);
      std::streambuf::pubsetbuf(pcVar4,(long)pcVar5);
    }
    piVar3 = pmVar2->pstr;
    _Var1 = std::__cxx11::string::c_str();
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)piVar3,_Var1);
    uVar6 = std::ios::good();
    if ((uVar6 & 1) == 0) {
      in_stack_ffffffffffffffa0 = (fpos<__mbstate_t> *)pmVar2->pstr;
      if (in_stack_ffffffffffffffa0 != (fpos<__mbstate_t> *)0x0) {
        (**(code **)(in_stack_ffffffffffffffa0->_M_off + 8))();
      }
      pmVar2->pstr = (ifstream *)0x0;
      FileOpenFailed((string *)in_stack_ffffffffffffffd8);
    }
    pmVar2->isOpen = true;
    std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    (pmVar2->currentPosition)._M_off = local_30;
    (pmVar2->currentPosition)._M_state = in_stack_ffffffffffffffd8;
  }
  return pmVar2->pstr;
}

Assistant:

std::ifstream *VisMF::OpenStream(const std::string &fileName) {
  VisMF::PersistentIFStream &pifs = VisMF::persistentIFStreams[fileName];
  if( ! pifs.isOpen) {
    pifs.pstr = new std::ifstream;
    if(setBuf) {
      pifs.ioBuffer.resize(ioBufferSize);
      pifs.pstr->rdbuf()->pubsetbuf(pifs.ioBuffer.dataPtr(), pifs.ioBuffer.size());
    }
    pifs.pstr->open(fileName.c_str(), std::ios::in | std::ios::binary);
    if( ! pifs.pstr->good()) {
      delete pifs.pstr;
      pifs.pstr = nullptr;
      amrex::FileOpenFailed(fileName);
    }
    pifs.isOpen = true;
    pifs.currentPosition = 0;
  }

  return pifs.pstr;
}